

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::deinit(InterCallTestCase *this)

{
  ShaderProgram *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppSVar5;
  reference pvVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppVar8;
  Functions *gl;
  _Rb_tree_const_iterator<std::pair<const_int,_unsigned_int>_> local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_int,_unsigned_int>_> local_20;
  const_iterator it;
  int ndx_1;
  int ndx;
  InterCallTestCase *this_local;
  
  for (it._M_node._4_4_ = 0; iVar3 = it._M_node._4_4_,
      sVar4 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::size
                        (&this->m_operationPrograms), iVar3 < (int)sVar4;
      it._M_node._4_4_ = it._M_node._4_4_ + 1) {
    ppSVar5 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::operator[]
                        (&this->m_operationPrograms,(long)it._M_node._4_4_);
    this_00 = *ppSVar5;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
  }
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::clear
            (&this->m_operationPrograms);
  for (it._M_node._0_4_ = 0; iVar3 = (int)it._M_node,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->m_operationResultStorages), iVar3 < (int)sVar4;
      it._M_node._0_4_ = (int)it._M_node + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_operationResultStorages,(long)(int)it._M_node);
    if (*pvVar6 != 0) {
      pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar7->_vptr_RenderContext[3])();
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x438);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_operationResultStorages,(long)(int)it._M_node);
      (*pcVar1)(1,pvVar6);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_operationResultStorages);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
       ::begin(&this->m_storageIDs);
  std::_Rb_tree_const_iterator<std::pair<const_int,_unsigned_int>_>::_Rb_tree_const_iterator
            (&local_20,&local_28);
  while( true ) {
    gl = (Functions *)
         std::
         map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
         ::end(&this->m_storageIDs);
    std::_Rb_tree_const_iterator<std::pair<const_int,_unsigned_int>_>::_Rb_tree_const_iterator
              (&local_30,(iterator *)&gl);
    bVar2 = std::operator!=(&local_20,&local_30);
    if (!bVar2) break;
    pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar3 = (*pRVar7->_vptr_RenderContext[3])();
    if (this->m_storage == STORAGE_BUFFER) {
      pcVar1 = *(code **)(CONCAT44(extraout_var_00,iVar3) + 0x438);
      ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_int,_unsigned_int>_>::operator->
                         (&local_20);
      (*pcVar1)(1,&ppVar8->second);
    }
    else if (this->m_storage == STORAGE_IMAGE) {
      pcVar1 = *(code **)(CONCAT44(extraout_var_00,iVar3) + 0x480);
      ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_int,_unsigned_int>_>::operator->
                         (&local_20);
      (*pcVar1)(1,&ppVar8->second);
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_unsigned_int>_>::operator++(&local_20);
  }
  std::map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::clear(&this->m_storageIDs);
  return;
}

Assistant:

void InterCallTestCase::deinit (void)
{
	// programs
	for (int ndx = 0; ndx < (int)m_operationPrograms.size(); ++ndx)
		delete m_operationPrograms[ndx];
	m_operationPrograms.clear();

	// result storages
	for (int ndx = 0; ndx < (int)m_operationResultStorages.size(); ++ndx)
	{
		if (m_operationResultStorages[ndx])
			m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_operationResultStorages[ndx]);
	}
	m_operationResultStorages.clear();

	// storage
	for (std::map<int, glw::GLuint>::const_iterator it = m_storageIDs.begin(); it != m_storageIDs.end(); ++it)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (m_storage == STORAGE_BUFFER)
			gl.deleteBuffers(1, &it->second);
		else if (m_storage == STORAGE_IMAGE)
			gl.deleteTextures(1, &it->second);
		else
			DE_ASSERT(DE_FALSE);
	}
	m_storageIDs.clear();
}